

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O0

CFavoriteServer * __thiscall
CServerBrowserFavorites::FindFavoriteByHostname
          (CServerBrowserFavorites *this,char *pHostname,int *Index)

{
  int iVar1;
  int *in_RDX;
  char *in_RDI;
  int i;
  char *in_stack_ffffffffffffffc8;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0xbc00) <= local_24) {
      return (CFavoriteServer *)0x0;
    }
    iVar1 = str_comp(in_RDI,in_stack_ffffffffffffffc8);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = local_24;
  }
  return (CFavoriteServer *)(in_RDI + (long)local_24 * 0xbc);
}

Assistant:

CServerBrowserFavorites::CFavoriteServer *CServerBrowserFavorites::FindFavoriteByHostname(const char *pHostname, int *Index)
{
	for(int i = 0; i < m_NumFavoriteServers; i++)
	{
		if(str_comp(pHostname, m_aFavoriteServers[i].m_aHostname) == 0)
		{
			if(Index)
				*Index = i;
			return &m_aFavoriteServers[i];
		}
	}

	return 0;
}